

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

void __thiscall SocketInternals::~SocketInternals(SocketInternals *this)

{
  SocketInternals *this_local;
  
  Close(this);
  std::__cxx11::string::~string((string *)&this->InterfaceName);
  return;
}

Assistant:

SocketInternals::~SocketInternals()
{
    Close();
}